

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O1

string * __thiscall
duckdb::Varint::FromByteArray_abi_cxx11_
          (string *__return_storage_ptr__,Varint *this,uint8_t *data,idx_t size,bool is_negative)

{
  pointer pcVar1;
  uint uVar2;
  uint8_t *puVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)data + '\x03');
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar2 = -(int)size ^ ((uint)data | 0x800000);
  *pcVar1 = (char)(uVar2 >> 0x10);
  pcVar1[1] = (char)(uVar2 >> 8);
  pcVar1[2] = (char)uVar2;
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((int)size == 0) {
    if (data != (uint8_t *)0x0) {
      puVar3 = (uint8_t *)0x0;
      do {
        *(Varint *)(puVar3 + (long)(pcVar1 + 3)) = this[(long)puVar3];
        puVar3 = puVar3 + 1;
      } while (data != puVar3);
    }
  }
  else if (data != (uint8_t *)0x0) {
    puVar3 = (uint8_t *)0x0;
    do {
      puVar3[(long)(pcVar1 + 3)] = ~(byte)this[(long)puVar3];
      puVar3 = puVar3 + 1;
    } while (data != puVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string Varint::FromByteArray(uint8_t *data, idx_t size, bool is_negative) {
	string result(VARINT_HEADER_SIZE + size, '0');
	SetHeader(&result[0], size, is_negative);
	uint8_t *result_data = reinterpret_cast<uint8_t *>(&result[VARINT_HEADER_SIZE]);
	if (is_negative) {
		for (idx_t i = 0; i < size; i++) {
			result_data[i] = ~data[i];
		}
	} else {
		for (idx_t i = 0; i < size; i++) {
			result_data[i] = data[i];
		}
	}
	return result;
}